

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O1

ExprP<float> __thiscall
vkt::shaderexecutor::
createApply<vkt::shaderexecutor::Signature<float,bool,float,float,vkt::shaderexecutor::Void>>
          (shaderexecutor *this,
          Func<vkt::shaderexecutor::Signature<float,_bool,_float,_float,_vkt::shaderexecutor::Void>_>
          *func,ExprP<bool> *arg0,ExprP<float> *arg1,ExprP<float> *arg2,
          ExprP<vkt::shaderexecutor::Void> *arg3)

{
  Expr<float> *ptr;
  ExprP<float> EVar1;
  
  ptr = (Expr<float> *)operator_new(0x50);
  (ptr->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__Apply_00d6e0d8;
  ptr[1].super_ExprBase._vptr_ExprBase = (_func_int **)func;
  Tuple4<vkt::shaderexecutor::ExprP<bool>,_vkt::shaderexecutor::ExprP<float>,_vkt::shaderexecutor::ExprP<float>,_vkt::shaderexecutor::ExprP<vkt::shaderexecutor::Void>_>
  ::Tuple4((Tuple4<vkt::shaderexecutor::ExprP<bool>,_vkt::shaderexecutor::ExprP<float>,_vkt::shaderexecutor::ExprP<float>,_vkt::shaderexecutor::ExprP<vkt::shaderexecutor::Void>_>
            *)(ptr + 2),arg0,arg1,arg2,arg3);
  EVar1 = exprP<float>(this,ptr);
  EVar1.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.m_ptr =
       (Expr<float> *)this;
  return (ExprP<float>)
         EVar1.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>;
}

Assistant:

ExprP<typename Sig::Ret> createApply (
	const Func<Sig>&			func,
	const ExprP<typename Sig::Arg0>&	arg0 = voidP(),
	const ExprP<typename Sig::Arg1>&	arg1 = voidP(),
	const ExprP<typename Sig::Arg2>&	arg2 = voidP(),
	const ExprP<typename Sig::Arg3>&	arg3 = voidP())
{
	return exprP(new Apply<Sig>(func, arg0, arg1, arg2, arg3));
}